

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_hpf2_init(ma_hpf2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                      ma_hpf2 *pHPF)

{
  ma_result mVar1;
  void *pHeap;
  size_t __size;
  double __x;
  
  __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
  sin(__x);
  sin(1.5707963267948966 - __x);
  if ((ulong)pConfig->channels == 0) {
    return MA_INVALID_ARGS;
  }
  __size = (ulong)pConfig->channels << 3;
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pHeap = malloc(__size);
  }
  else {
    if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      return MA_OUT_OF_MEMORY;
    }
    pHeap = (*pAllocationCallbacks->onMalloc)(__size,pAllocationCallbacks->pUserData);
  }
  if (pHeap == (void *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  mVar1 = ma_hpf2_init_preallocated(pConfig,pHeap,pHPF);
  if (mVar1 == MA_SUCCESS) {
    (pHPF->bq)._ownsHeap = 1;
    return MA_SUCCESS;
  }
  ma_free(pHeap,pAllocationCallbacks);
  return mVar1;
}

Assistant:

MA_API ma_result ma_hpf2_init(const ma_hpf2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_hpf2* pHPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_hpf2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_hpf2_init_preallocated(pConfig, pHeap, pHPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pHPF->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}